

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
BlockDevice::GetVolumeList_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,BlockDevice *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lVolumes;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> BlockDevice::GetVolumeList() const
{
    std::vector<std::string> lVolumes;

#ifdef _WIN32
    STORAGE_DEVICE_NUMBER sdn;
    DWORD dwRet;

    if (DeviceIoControl(hdev, IOCTL_STORAGE_GET_DEVICE_NUMBER, nullptr, 0, &sdn, sizeof(sdn), &dwRet, nullptr))
    {
        DWORD dwDrives = GetLogicalDrives();
        char szDrive[] = R"(\\.\X:)";

        for (char i = 0; i < 26; ++i)
        {
            // Skip non-existent drives
            if (!(dwDrives & (1 << i)))
                continue;

            // Form the volume device path
            szDrive[4] = 'A' + i;

            // Open the volume without accessing the drive contents
            HANDLE hdevice = CreateFile(szDrive, 0, FILE_SHARE_WRITE, nullptr, OPEN_EXISTING, 0, nullptr);
            if (hdevice != INVALID_HANDLE_VALUE)
            {
                BYTE ab[256];
                PVOLUME_DISK_EXTENTS pvde = reinterpret_cast<PVOLUME_DISK_EXTENTS>(ab);

                // Get the extents of the volume, which may span multiple physical drives
                if (DeviceIoControl(hdevice, IOCTL_VOLUME_GET_VOLUME_DISK_EXTENTS, nullptr, 0, pvde, sizeof(ab), &dwRet, nullptr))
                {
                    // Check each extent against the supplied drive number, and mark any matches
                    for (DWORD u = 0; u < pvde->NumberOfDiskExtents; ++u)
                        if (pvde->Extents[u].DiskNumber == sdn.DeviceNumber)
                            lVolumes.push_back(szDrive + 4);
                }

                CloseHandle(hdevice);
            }
        }
    }
#endif

    return lVolumes;
}